

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O0

RC __thiscall QL_NodeRel::SetUpNode(QL_NodeRel *this,int *attrs,int attrlistSize)

{
  int *piVar1;
  int local_24;
  int i;
  RC rc;
  int attrlistSize_local;
  int *attrs_local;
  QL_NodeRel *this_local;
  
  (this->super_QL_Node).attrsInRecSize = attrlistSize;
  piVar1 = (int *)malloc((long)attrlistSize << 2);
  (this->super_QL_Node).attrsInRec = piVar1;
  memset((this->super_QL_Node).attrsInRec,0,8);
  for (local_24 = 0; local_24 < attrlistSize; local_24 = local_24 + 1) {
    (this->super_QL_Node).attrsInRec[local_24] = attrs[local_24];
  }
  (this->super_QL_Node).listsInitialized = true;
  return 0;
}

Assistant:

RC QL_NodeRel::SetUpNode(int *attrs, int attrlistSize){
  RC rc = 0;
  attrsInRecSize = attrlistSize;
  attrsInRec = (int*)malloc(attrlistSize*sizeof(int));
  memset((void *)attrsInRec, 0, sizeof(attrsInRec));
  for(int i = 0; i < attrlistSize; i++){
    attrsInRec[i] = attrs[i];
  }
  listsInitialized = true;

  return (rc);
}